

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SomeTests.cpp
# Opt level: O0

void __thiscall
OrderBookTests_SpreadCalculated_Test::OrderBookTests_SpreadCalculated_Test
          (OrderBookTests_SpreadCalculated_Test *this)

{
  OrderBookTests_SpreadCalculated_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__OrderBookTests_SpreadCalculated_Test_001a9078;
  return;
}

Assistant:

TEST(OrderBookTests, SpreadCalculated){
    OrderBook book;
    book.add_bid(50, 100);
    book.add_ask(70, 100);
    auto bidask = book.get_bid_ask();
    EXPECT_TRUE(bidask.bid.is_initialized());
    EXPECT_TRUE(bidask.ask.is_initialized());
    auto spread = bidask.spread();
    EXPECT_TRUE(spread.is_initialized());
    EXPECT_EQ(20, spread.get());
}